

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_rr_idirect(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGContext_conflict9 *tcg_ctx_01;
  uint uVar1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uint uVar4;
  uintptr_t o_2;
  TCGContext_conflict9 *tcg_ctx;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x14;
  if (3 < (byte)uVar1) {
    pTVar2 = tcg_const_i32_tricore(tcg_ctx_00,2);
    pTVar3 = tcg_const_i32_tricore(tcg_ctx_00,1);
    tcg_ctx_01 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(tcg_ctx_01,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_01->cpu_PC + (long)tcg_ctx_01)
                        ,(long)(int)(ctx->base).pc_next);
    local_38 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    local_30 = (TCGTemp *)(pTVar2 + (long)tcg_ctx_00);
    local_28 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
    tcg_gen_callN_tricore(tcg_ctx_00,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_38);
    (ctx->base).is_jmp = DISAS_NORETURN;
    tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar2 + (long)tcg_ctx_00));
    tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar3 + (long)tcg_ctx_00));
    goto LAB_00d300d0;
  }
  uVar4 = ctx->opcode >> 8 & 0xf;
  switch(uVar1 & 0xff) {
  case 0:
    pTVar2 = tcg_const_i32_tricore(tcg_ctx_00,ctx->pc_succ_insn);
    local_38 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    local_30 = (TCGTemp *)(pTVar2 + (long)tcg_ctx_00);
    tcg_gen_callN_tricore(tcg_ctx_00,helper_call,(TCGTemp *)0x0,2,&local_38);
    tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar2 + (long)tcg_ctx_00));
    break;
  case 1:
    gen_fcall_save_ctx(ctx);
    break;
  case 2:
    tcg_gen_op2_tricore(tcg_ctx_00,INDEX_op_movi_i32,
                        (TCGArg)(tcg_ctx_00->cpu_gpr_a[0xb] + (long)tcg_ctx_00),
                        (long)(int)ctx->pc_succ_insn);
    break;
  case 3:
    pTVar2 = tcg_ctx_00->cpu_PC;
    pTVar3 = tcg_ctx_00->cpu_gpr_a[uVar4];
    goto LAB_00d300c3;
  }
  pTVar2 = tcg_ctx_00->cpu_PC;
  pTVar3 = tcg_ctx_00->cpu_gpr_a[uVar4];
LAB_00d300c3:
  tcg_gen_andi_i32_tricore(tcg_ctx_00,pTVar2,pTVar3,-2);
LAB_00d300d0:
  tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)0x0,0);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void decode_rr_idirect(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1;

    op2 = MASK_OP_RR_OP2(ctx->opcode);
    r1 = MASK_OP_RR_S1(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR_JI:
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_JLI:
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_a[11], ctx->pc_succ_insn);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_CALLI:
        gen_helper_1arg(tcg_ctx, call, ctx->pc_succ_insn);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_FCALLI:
        gen_fcall_save_ctx(ctx);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    ctx->base.is_jmp = DISAS_NORETURN;
}